

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

void __thiscall
s2shapeutil::anon_unknown_0::IndexCrosser::IndexCrosser
          (IndexCrosser *this,S2ShapeIndex *a_index,S2ShapeIndex *b_index,CrossingType type,
          EdgePairVisitor *visitor,bool swapped)

{
  bool swapped_local;
  EdgePairVisitor *visitor_local;
  CrossingType type_local;
  S2ShapeIndex *b_index_local;
  S2ShapeIndex *a_index_local;
  IndexCrosser *this_local;
  
  this->a_index_ = a_index;
  this->b_index_ = b_index;
  this->visitor_ = visitor;
  this->min_crossing_sign_ = (uint)(type == INTERIOR);
  this->swapped_ = swapped;
  S2CrossingEdgeQuery::S2CrossingEdgeQuery(&this->b_query_,this->b_index_);
  std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::vector
            (&this->b_cells_);
  absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
  InlinedVector(&this->a_shape_edges_);
  absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
  InlinedVector(&this->b_shape_edges_);
  return;
}

Assistant:

IndexCrosser(const S2ShapeIndex& a_index, const S2ShapeIndex& b_index,
               CrossingType type, const EdgePairVisitor& visitor, bool swapped)
      : a_index_(a_index), b_index_(b_index), visitor_(visitor),
        min_crossing_sign_(type == CrossingType::INTERIOR ? 1 : 0),
        swapped_(swapped), b_query_(&b_index_) {
  }